

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_helper.cpp
# Opt level: O3

bool duckdb::ExtensionHelper::TryAutoLoadExtension(ClientContext *context,string *extension_name)

{
  bool bVar1;
  DatabaseInstance *this;
  DBConfig *pDVar2;
  string *url;
  ExtensionRepository autoinstall_repo;
  ExtensionInstallInfo *local_d0;
  RETURN_TYPE local_c8;
  undefined1 local_a8 [24];
  undefined1 local_90 [56];
  char local_58 [16];
  char *local_48;
  char local_38 [16];
  
  this = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&context->db);
  bVar1 = DatabaseInstance::ExtensionIsLoaded(this,extension_name);
  if (!bVar1) {
    pDVar2 = DBConfig::GetConfig(context);
    if ((pDVar2->options).autoinstall_known_extensions == true) {
      pDVar2 = DBConfig::GetConfig(context);
      DBConfig::GetSetting<duckdb::AutoinstallExtensionRepositorySetting>(&local_c8,pDVar2,context);
      Value::Value((Value *)local_a8,&local_c8);
      url = StringValue::Get_abi_cxx11_((Value *)local_a8);
      ExtensionRepository::GetRepositoryByUrl((ExtensionRepository *)(local_90 + 0x28),url);
      Value::~Value((Value *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      local_a8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_90[0] = false;
      local_90._16_2_ = 0;
      local_90[0x12] = 0;
      local_a8._0_8_ = (ExtensionRepository *)(local_90 + 0x28);
      local_a8._8_8_ = (element_type *)local_90;
      InstallExtension((ExtensionHelper *)&local_d0,context,extension_name,
                       (ExtensionInstallOptions *)local_a8);
      if (local_d0 != (ExtensionInstallInfo *)0x0) {
        ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                  ((default_delete<duckdb::ExtensionInstallInfo> *)&local_d0,local_d0);
      }
      local_d0 = (ExtensionInstallInfo *)0x0;
      if ((element_type *)local_a8._8_8_ != (element_type *)local_90) {
        operator_delete((void *)local_a8._8_8_);
      }
      if (local_48 != local_38) {
        operator_delete(local_48);
      }
      if ((char *)local_90._40_8_ != local_58) {
        operator_delete((void *)local_90._40_8_);
      }
    }
    LoadExternalExtension(context,extension_name);
  }
  return true;
}

Assistant:

bool ExtensionHelper::TryAutoLoadExtension(ClientContext &context, const string &extension_name) noexcept {
	if (context.db->ExtensionIsLoaded(extension_name)) {
		return true;
	}
	auto &dbconfig = DBConfig::GetConfig(context);
	try {
		if (dbconfig.options.autoinstall_known_extensions) {
			auto &config = DBConfig::GetConfig(context);
			auto autoinstall_repo = ExtensionRepository::GetRepositoryByUrl(
			    StringValue::Get(config.GetSetting<AutoinstallExtensionRepositorySetting>(context)));
			ExtensionInstallOptions options;
			options.repository = autoinstall_repo;
			ExtensionHelper::InstallExtension(context, extension_name, options);
		}
		ExtensionHelper::LoadExternalExtension(context, extension_name);
		return true;
	} catch (...) {
		return false;
	}
}